

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  code **ppcVar1;
  Value *type;
  ushort uVar2;
  undefined2 uVar3;
  BaseType BVar4;
  uint uVar5;
  StructDef *field;
  long lVar6;
  Definition *pDVar7;
  Type type_00;
  bool bVar8;
  undefined8 uVar9;
  undefined2 uVar10;
  undefined6 uVar11;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var12;
  KotlinGenerator *this_00;
  long *plVar13;
  mapped_type *pmVar14;
  unsigned_long t;
  size_t t_00;
  undefined8 *puVar15;
  long *plVar16;
  CodeWriter *pCVar17;
  ulong uVar18;
  _Base_ptr p_Var19;
  code *pcVar20;
  undefined8 uVar21;
  pointer ppFVar22;
  Type *type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_index;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string return_type;
  string field_type;
  string offset_val;
  string field_default_value;
  FieldDef *key_field;
  string bbgetter;
  string ucast;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  BaseType in_stack_fffffffffffffd68;
  BaseType BVar23;
  BaseType in_stack_fffffffffffffd6c;
  _Alloc_hider _Var24;
  BaseType BVar25;
  StructDef *local_290;
  undefined1 auStack_288 [10];
  undefined4 uStack_27e;
  undefined2 uStack_27a;
  undefined1 local_278 [16];
  undefined1 auStack_268 [16];
  _Any_data local_258;
  undefined1 local_248 [16];
  CodeWriter *local_238;
  undefined4 local_22c;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  _Any_data local_1e8;
  _Base_ptr local_1d8;
  _Base_ptr p_Stack_1d0;
  KotlinGenerator *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  StructDef *local_1a0;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  _Any_data local_158;
  _Base_ptr local_148;
  code *local_140;
  IdlNamer *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  string local_110;
  undefined1 local_f0 [32];
  string local_d0;
  _Alloc_hider local_b0;
  string local_a8;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  long *local_68;
  long local_58 [2];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_48;
  
  local_238 = writer;
  local_1a0 = struct_def;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_48,&(struct_def->fields).vec);
  _Var24._M_p = (pointer)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
  local_b0._M_p = (pointer)0x0;
  local_1c8 = this;
  if (local_48.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_138 = &this->namer_;
    ppFVar22 = local_48.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      field = (StructDef *)*ppFVar22;
      if (field->fixed == false) {
        if (field->predecl == true) {
          local_b0._M_p = (pointer)field;
        }
        GenerateComment(this,&(field->super_Definition).doc_comment,local_238,
                        (CommentConfig *)(anonymous_namespace)::comment_config);
        (*(local_138->super_Namer)._vptr_Namer[0x12])(&local_198,local_138,field);
        this_00 = local_1c8;
        type = (Value *)&field->fields;
        GenTypeGet_abi_cxx11_(&local_110,local_1c8,(Type *)type);
        GenDefaultValue_abi_cxx11_(&local_d0,this_00,(FieldDef *)field,false);
        GetterReturnType_abi_cxx11_((string *)&local_130,this_00,(FieldDef *)field);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"bb","");
        ByteBufferGetter((string *)&local_88,local_1c8,(Type *)type,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        p_Var12 = &(field->fields).dict._M_t._M_impl;
        uVar9 = (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        uVar10 = *(uint16_t *)
                  &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar11 = *(undefined6 *)
                  ((long)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                  + 2);
        type_00.enum_def._2_6_ = uVar11;
        type_00.enum_def._0_2_ = uVar10;
        type_00.struct_def = (StructDef *)uVar9;
        type_00.base_type = (p_Var12->super__Rb_tree_header)._M_header._M_color;
        type_00.element = *(BaseType *)&(p_Var12->super__Rb_tree_header)._M_header.field_0x4;
        type_00._24_4_ = (BaseType)_Var24._M_p;
        type_00._28_4_ = (BaseType)((ulong)_Var24._M_p >> 0x20);
        CastToUsigned_abi_cxx11_(type_00);
        NumToString<unsigned_short>((string *)local_f0,((Value *)&field->fields)->offset);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffd68,"val o = __offset(",(string *)local_f0);
        plVar13 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffd68);
        plVar16 = plVar13 + 2;
        if ((long *)*plVar13 == plVar16) {
          local_168 = *plVar16;
          lStack_160 = plVar13[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *plVar16;
          local_178 = (long *)*plVar13;
        }
        local_170 = plVar13[1];
        *plVar13 = (long)plVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        BVar4 = (type->type).base_type;
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"offset","");
        NumToString<unsigned_short>((string *)local_278,((Value *)&field->fields)->offset);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
        }
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"return_type","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"field_type","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"field_name","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"field_default","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"bbgetter","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        _Var24._M_p = auStack_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd68,"ucast","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&local_238->value_map_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        if (_Var24._M_p != auStack_288) {
          operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
        }
        if (BVar4 == BASE_TYPE_VECTOR) {
          if ((((Value *)&field->fields)->type).element == BASE_TYPE_STRUCT) {
            _Var24._M_p = auStack_288;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffd68,"j: Int","");
            local_278._8_8_ = (StructDef *)0x0;
            local_278._0_8_ = local_238;
            auStack_268._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
                 ::_M_invoke;
            auStack_268._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
                 ::_M_manager;
            GenerateFunOneLine(local_238,&local_198,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffd68,(string *)&local_130,
                               (function<void_()> *)local_278,false);
            if ((_Base_ptr)auStack_268._0_8_ != (_Base_ptr)0x0) {
              (*(code *)auStack_268._0_8_)((string *)local_278,(string *)local_278,3);
            }
            if (_Var24._M_p != auStack_288) {
              operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
            }
          }
switchD_001daaee_caseD_e:
          BVar23 = (((Value *)&field->fields)->type).element;
          local_290 = (((Value *)&field->fields)->type).struct_def;
          auStack_288._0_8_ =
               (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          auStack_288._8_2_ = (((Value *)&field->fields)->type).fixed_length;
          local_278._0_8_ = auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"j: Int","");
          if (BVar23 - BASE_TYPE_STRUCT < 2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_228,"obj: ",&local_110);
            plVar13 = (long *)std::__cxx11::string::append(local_228._M_pod_data);
            pCVar17 = (CodeWriter *)(plVar13 + 2);
            if ((CodeWriter *)*plVar13 == pCVar17) {
              local_248._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
              local_248._8_8_ = plVar13[3];
              local_258._M_unused._M_object = (CodeWriter *)local_248;
            }
            else {
              local_248._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
              local_258._M_unused._M_object = (CodeWriter *)*plVar13;
            }
            local_258._8_8_ = plVar13[1];
            *plVar13 = (long)pCVar17;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_278,(string *)local_258._M_pod_data);
            if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
              operator_delete(local_258._M_unused._M_object,
                              (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
            }
            if ((code **)local_228._M_unused._0_8_ != &local_218) {
              operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
            }
          }
          local_258._8_8_ = (_Base_ptr)0x0;
          local_258._M_unused._M_object = operator_new(0x20);
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           local_258._M_unused._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffd68;
          ((_Base_ptr)local_258._M_unused._0_8_)->_M_parent = (_Base_ptr)field;
          ((_Base_ptr)local_258._M_unused._0_8_)->_M_left = (_Base_ptr)local_238;
          ((_Base_ptr)local_258._M_unused._0_8_)->_M_right = (_Base_ptr)local_f0;
          local_248._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1073:66)>
               ::_M_invoke;
          local_248._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1073:66)>
               ::_M_manager;
          GenerateFun(local_238,&local_198,(string *)local_278,(string *)&local_130,
                      (function<void_()> *)&local_258,false);
          if ((_Base_ptr)local_248._0_8_ != (_Base_ptr)0x0) {
            (*(code *)local_248._0_8_)(&local_258,&local_258,3);
          }
          if ((undefined1 *)local_278._0_8_ != auStack_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
          }
          _Var24._M_p = auStack_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffd68,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          std::__cxx11::string::append((char *)&stack0xfffffffffffffd68);
          local_278._0_8_ = auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Int","");
          local_258._M_unused._M_object = local_238;
          local_258._8_8_ = local_f0;
          local_248._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1114:62)>
               ::_M_invoke;
          local_248._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1114:62)>
               ::_M_manager;
          GenerateGetter(local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffd68,(string *)local_278,
                         (function<void_()> *)&local_258);
          if ((_Base_ptr)local_248._0_8_ != (_Base_ptr)0x0) {
            (*(code *)local_248._0_8_)(&local_258,&local_258,3);
          }
          if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
          }
          if (_Var24._M_p != auStack_288) {
            operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
          }
          uVar5 = *(uint *)&(field->fields).dict._M_t._M_impl.field_0x4;
          if (uVar5 != 0xf) {
LAB_001db4d5:
            plVar13 = (long *)(ulong)uVar5;
            if (uVar5 - 1 < 0xc) {
              uVar2 = *(ushort *)
                       &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              uVar18 = (ulong)uVar2;
              local_278._4_4_ = 0;
              local_278._0_4_ = uVar5;
              local_278._8_8_ =
                   *(undefined8 *)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header
              ;
              auStack_268._0_8_ =
                   (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              auStack_268._8_2_ = uVar2;
              t = InlineSize((Type *)local_278);
              local_22c = (undefined4)CONCAT71((int7)(uVar18 >> 8),1);
            }
            else {
LAB_001db529:
              local_22c = (undefined4)CONCAT71((int7)((ulong)plVar13 >> 8),1);
              if (BVar4 != BASE_TYPE_STRING) goto LAB_001db7af;
LAB_001db54a:
              t = 1;
            }
            NumToString<unsigned_long>((string *)&stack0xfffffffffffffd68,t);
            local_278._0_8_ = (CodeWriter *)auStack_268;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            std::__cxx11::string::append((char *)local_278);
            local_258._M_unused._M_object = (CodeWriter *)local_248;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"ByteBuffer","");
            local_228._M_unused._M_object = local_238;
            pcStack_210 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
                          ::_M_invoke;
            local_218 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
                        ::_M_manager;
            local_228._8_8_ = (_Alloc_hider *)&stack0xfffffffffffffd68;
            GenerateGetterOneLine
                      (local_238,(string *)local_278,(string *)&local_258,
                       (function<void_()> *)&local_228);
            if (local_218 != (code *)0x0) {
              (*local_218)(&local_228,&local_228,3);
            }
            if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
              operator_delete(local_258._M_unused._M_object,
                              (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
            }
            if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
            }
            local_278._0_8_ = (CodeWriter *)auStack_268;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            std::__cxx11::string::append((char *)local_278);
            local_258._M_unused._M_object = (CodeWriter *)local_248;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_258,"_bb: ByteBuffer","");
            local_228._M_unused._M_object = &local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"ByteBuffer","");
            local_208._M_unused._M_object = local_238;
            pcStack_1f0 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
                          ::_M_invoke;
            local_1f8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
                        ::_M_manager;
            local_208._8_8_ = (_Alloc_hider *)&stack0xfffffffffffffd68;
            GenerateFunOneLine(local_238,(string *)local_278,(string *)&local_258,
                               (string *)&local_228,(function<void_()> *)&local_208,false);
            if (local_1f8 != (code *)0x0) {
              (*local_1f8)(&local_208,&local_208,3);
            }
            if ((code **)local_228._M_unused._0_8_ != &local_218) {
              operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
            }
            if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
              operator_delete(local_258._M_unused._M_object,
                              (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
            }
            if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
            }
            if (_Var24._M_p != auStack_288) {
              operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
            }
            goto LAB_001db7ab;
          }
          pDVar7 = *(Definition **)
                    &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header;
          local_22c = 1;
          if (*(char *)&pDVar7[1].doc_comment.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish == '\0') {
            plVar13 = (long *)pDVar7[1].file.field_2._M_allocated_capacity;
            plVar16 = *(long **)((long)&pDVar7[1].file.field_2 + 8);
            if (plVar13 != plVar16) {
              do {
                lVar6 = *plVar13;
                if (*(char *)(lVar6 + 0x111) == '\x01') {
                  local_278._0_8_ = auStack_268;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
                  BaseGenerator::WrapInNameSpace
                            ((string *)&stack0xfffffffffffffd68,&local_1c8->super_BaseGenerator,
                             pDVar7,(string *)local_278);
                  if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
                    operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
                  }
                  local_258._M_unused._M_object = local_248;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"ByKey","");
                  (*(local_138->super_Namer)._vptr_Namer[3])
                            ((_Alloc_hider *)local_278,local_138,field,&local_258);
                  if ((_Base_ptr)local_258._M_unused._0_8_ != (_Base_ptr)local_248) {
                    operator_delete(local_258._M_unused._M_object,
                                    (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
                  }
                  type_01 = (Type *)(lVar6 + 200);
                  GenTypeGet_abi_cxx11_((string *)&local_228,local_1c8,type_01);
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_228,0,(char *)0x0,0x36768e);
                  local_258._M_unused._M_object = local_248;
                  pCVar17 = (CodeWriter *)(plVar13 + 2);
                  if ((CodeWriter *)*plVar13 == pCVar17) {
                    local_248._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
                    local_248._8_8_ = plVar13[3];
                  }
                  else {
                    local_248._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
                    local_258._M_unused._M_object = (CodeWriter *)*plVar13;
                  }
                  local_258._8_8_ = plVar13[1];
                  *plVar13 = (long)pCVar17;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  if ((code **)local_228._M_unused._0_8_ != &local_218) {
                    operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
                  }
                  local_228._M_unused._M_object = &local_218;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_228,_Var24._M_p,
                             (long)&(local_290->super_Definition).name._M_dataplus._M_p +
                             _Var24._M_p);
                  std::__cxx11::string::append(local_228._M_pod_data);
                  local_208._8_8_ = 0;
                  local_208._M_unused._M_object = operator_new(0x18);
                  *(CodeWriter **)local_208._M_unused._0_8_ = local_238;
                  *(_Alloc_hider **)((long)local_208._M_unused._0_8_ + 8) = (_Alloc_hider *)local_f0
                  ;
                  *(_Base_ptr *)((long)local_208._M_unused._0_8_ + 0x10) =
                       (_Base_ptr)&stack0xfffffffffffffd68;
                  pcStack_1f0 = std::
                                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1130:56)>
                                ::_M_invoke;
                  local_1f8 = std::
                              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1130:56)>
                              ::_M_manager;
                  GenerateFun(local_238,(string *)local_278,(string *)&local_258,
                              (string *)&local_228,(function<void_()> *)&local_208,false);
                  if (local_1f8 != (code *)0x0) {
                    (*local_1f8)(&local_208,&local_208,3);
                  }
                  std::operator+(&local_1c0,"obj: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stack0xfffffffffffffd68);
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e8._M_unused._M_object = &local_1d8;
                  p_Var19 = (_Base_ptr)(plVar13 + 2);
                  if ((_Base_ptr)*plVar13 == p_Var19) {
                    local_1d8 = *(_Base_ptr *)p_Var19;
                    p_Stack_1d0 = (_Base_ptr)plVar13[3];
                  }
                  else {
                    local_1d8 = *(_Base_ptr *)p_Var19;
                    local_1e8._M_unused._M_object = (_Base_ptr)*plVar13;
                  }
                  local_1e8._8_8_ = plVar13[1];
                  *plVar13 = (long)p_Var19;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  GenTypeGet_abi_cxx11_((string *)&local_158,local_1c8,type_01);
                  p_Var19 = (_Base_ptr)0xf;
                  if ((_Base_ptr)local_1e8._M_unused._0_8_ != (_Base_ptr)&local_1d8) {
                    p_Var19 = local_1d8;
                  }
                  if (p_Var19 < (_Base_ptr)(local_158._8_8_ + local_1e8._8_8_)) {
                    p_Var19 = (_Base_ptr)0xf;
                    if ((_Base_ptr *)local_158._M_unused._0_8_ != &local_148) {
                      p_Var19 = local_148;
                    }
                    if (p_Var19 < (_Base_ptr)(local_158._8_8_ + local_1e8._8_8_)) goto LAB_001db2bf;
                    plVar13 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_158,0,(char *)0x0,
                                                 local_1e8._M_unused._M_member_pointer);
                  }
                  else {
LAB_001db2bf:
                    plVar13 = (long *)std::__cxx11::string::_M_append
                                                (local_1e8._M_pod_data,
                                                 local_158._M_unused._M_member_pointer);
                  }
                  pCVar17 = (CodeWriter *)(plVar13 + 2);
                  if ((CodeWriter *)*plVar13 == pCVar17) {
                    local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
                    pcStack_1f0 = (code *)plVar13[3];
                    local_208._M_unused._M_object = (CodeWriter *)&local_1f8;
                  }
                  else {
                    local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
                    local_208._M_unused._M_object = (CodeWriter *)*plVar13;
                  }
                  local_208._8_8_ = plVar13[1];
                  *plVar13 = (long)pCVar17;
                  plVar13[1] = 0;
                  *(undefined1 *)&(pCVar17->value_map_)._M_t._M_impl = 0;
                  if ((_Base_ptr *)local_158._M_unused._0_8_ != &local_148) {
                    operator_delete(local_158._M_unused._M_object,
                                    (ulong)((long)&local_148->_M_color + 1));
                  }
                  if ((_Base_ptr)local_1e8._M_unused._0_8_ != (_Base_ptr)&local_1d8) {
                    operator_delete(local_1e8._M_unused._M_object,
                                    (ulong)((long)&local_1d8->_M_color + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
                  }
                  local_1e8._8_8_ = (_Base_ptr)0x0;
                  local_1e8._M_unused._M_object = operator_new(0x18);
                  *(CodeWriter **)local_1e8._M_unused._0_8_ = local_238;
                  ((_Base_ptr)local_1e8._M_unused._0_8_)->_M_parent = (_Base_ptr)local_f0;
                  ((_Base_ptr)local_1e8._M_unused._0_8_)->_M_left =
                       (_Base_ptr)&stack0xfffffffffffffd68;
                  p_Stack_1d0 = (_Base_ptr)
                                std::
                                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1142:56)>
                                ::_M_invoke;
                  local_1d8 = (_Base_ptr)
                              std::
                              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1142:56)>
                              ::_M_manager;
                  GenerateFun(local_238,(string *)local_278,(string *)&local_208,
                              (string *)&local_228,(function<void_()> *)&local_1e8,false);
                  if (local_1d8 != (_Base_ptr)0x0) {
                    (*(code *)local_1d8)(&local_1e8,&local_1e8,3);
                  }
                  if ((CodeWriter *)local_208._M_unused._0_8_ != (CodeWriter *)&local_1f8) {
                    operator_delete(local_208._M_unused._M_object,(ulong)(local_1f8 + 1));
                  }
                  if ((code **)local_228._M_unused._0_8_ != &local_218) {
                    operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
                  }
                  if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
                    operator_delete(local_258._M_unused._M_object,
                                    (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
                  }
                  if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
                    operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
                  }
                  if (_Var24._M_p != auStack_288) {
                    operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
                  }
                  uVar5 = *(uint *)&(field->fields).dict._M_t._M_impl.field_0x4;
                  goto LAB_001db4d5;
                }
                plVar13 = plVar13 + 1;
              } while (plVar13 != plVar16);
              goto LAB_001db529;
            }
          }
LAB_001db7af:
          bVar8 = false;
        }
        else {
          BVar23 = (BaseType)local_238;
          BVar25 = (BaseType)((ulong)local_238 >> 0x20);
          if (BVar4 == BASE_TYPE_STRUCT) {
            local_290 = (StructDef *)0x0;
            stack0xfffffffffffffd80 =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:952:64)>
                 ::_M_invoke;
            auStack_288._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:952:64)>
                 ::_M_manager;
            GenerateGetterOneLine
                      (local_238,&local_198,(string *)&local_130,
                       (function<void_()> *)&stack0xfffffffffffffd68);
            _Var24._M_p = (pointer)CONCAT44(BVar25,BVar23);
            if ((_Base_ptr)auStack_288._0_8_ != (_Base_ptr)0x0) {
              (*(code *)auStack_288._0_8_)
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffd68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffd68,3);
              _Var24._M_p = (pointer)CONCAT44(BVar25,BVar23);
            }
switchD_001daaee_caseD_f:
            if (local_1a0->fixed == true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,"obj: ",&local_110);
              local_278._8_8_ = (StructDef *)0x0;
              local_278._0_8_ = local_238;
              auStack_268._8_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
                   ::_M_invoke;
              auStack_268._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
                   ::_M_manager;
              GenerateFunOneLine(local_238,&local_198,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stack0xfffffffffffffd68,(string *)&local_130,
                                 (function<void_()> *)local_278,false);
              if ((_Base_ptr)auStack_268._0_8_ != (_Base_ptr)0x0) {
                (*(code *)auStack_268._0_8_)((string *)local_278,(string *)local_278,3);
              }
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,"obj: ",&local_110);
              local_278._8_8_ = (StructDef *)0x0;
              local_278._0_8_ = operator_new(0x18);
              *(StructDef **)&(((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl = field;
              *(CodeWriter **)
               &(((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl.super__Rb_tree_header.
                _M_header = local_238;
              (((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_parent = (_Base_ptr)local_f0;
              auStack_268._8_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1003:74)>
                   ::_M_invoke;
              auStack_268._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1003:74)>
                   ::_M_manager;
              GenerateFun(local_238,&local_198,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xfffffffffffffd68,(string *)&local_130,
                          (function<void_()> *)local_278,false);
              if ((_Base_ptr)auStack_268._0_8_ != (_Base_ptr)0x0) {
                (*(code *)auStack_268._0_8_)((string *)local_278,(string *)local_278,3);
              }
            }
          }
          else {
            if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
              if (local_1a0->fixed == true) {
                stack0xfffffffffffffd80 =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:967:66)>
                     ::_M_invoke;
                auStack_288._0_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:967:66)>
                     ::_M_manager;
                GenerateGetterOneLine
                          (local_238,&local_198,(string *)&local_130,
                           (function<void_()> *)&stack0xfffffffffffffd68);
                if ((_Base_ptr)auStack_288._0_8_ != (_Base_ptr)0x0) {
                  (*(code *)auStack_288._0_8_)
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,3);
                }
              }
              else {
                stack0xfffffffffffffd80 =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:971:59)>
                     ::_M_invoke;
                auStack_288._0_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:971:59)>
                     ::_M_manager;
                GenerateGetter(local_238,&local_198,(string *)&local_130,
                               (function<void_()> *)&stack0xfffffffffffffd68);
                if ((_Base_ptr)auStack_288._0_8_ != (_Base_ptr)0x0) {
                  (*(code *)auStack_288._0_8_)
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,3);
                }
              }
              _Var24._M_p = (pointer)CONCAT44(BVar25,BVar23);
              local_290 = (StructDef *)0x0;
              bVar8 = true;
              local_22c = 0;
              goto LAB_001db7b6;
            }
            switch(BVar4) {
            case BASE_TYPE_STRING:
              stack0xfffffffffffffd80 =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1035:61)>
                   ::_M_invoke;
              auStack_288._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1035:61)>
                   ::_M_manager;
              GenerateGetter(local_238,&local_198,(string *)&local_130,
                             (function<void_()> *)&stack0xfffffffffffffd68);
              if ((_Base_ptr)auStack_288._0_8_ != (_Base_ptr)0x0) {
                (*(code *)auStack_288._0_8_)
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffd68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffd68,3);
              }
              _Var24._M_p = (pointer)CONCAT44(BVar25,BVar23);
              local_22c = 0;
              local_290 = field;
              goto LAB_001db54a;
            case BASE_TYPE_VECTOR:
              goto switchD_001daaee_caseD_e;
            case BASE_TYPE_STRUCT:
              goto switchD_001daaee_caseD_f;
            case BASE_TYPE_UNION:
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffd68,"obj: ",&local_110);
              local_278._8_8_ = (StructDef *)0x0;
              local_278._0_8_ = operator_new(0x18);
              *(CodeWriter **)&(((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl =
                   local_238;
              *(_Alloc_hider **)
               &(((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl.super__Rb_tree_header.
                _M_header = (_Alloc_hider *)local_f0;
              (((CodeWriter *)local_278._0_8_)->value_map_)._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_parent = (_Base_ptr)&local_88;
              auStack_268._8_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1103:72)>
                   ::_M_invoke;
              auStack_268._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1103:72)>
                   ::_M_manager;
              GenerateFun(local_238,&local_198,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xfffffffffffffd68,(string *)&local_130,
                          (function<void_()> *)local_278,false);
              if ((_Base_ptr)auStack_268._0_8_ != (_Base_ptr)0x0) {
                (*(code *)auStack_268._0_8_)((string *)local_278,(string *)local_278,3);
              }
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp"
                            ,0x454,
                            "void flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                           );
            }
          }
          if (_Var24._M_p != auStack_288) {
            operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
          }
          local_22c = 0;
LAB_001db7ab:
          bVar8 = false;
        }
LAB_001db7b6:
        pDVar7 = (Definition *)field->bytesize;
        if (pDVar7 != (Definition *)0x0) {
          local_278._0_8_ = auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
          BaseGenerator::WrapInNameSpace
                    ((string *)&stack0xfffffffffffffd68,&local_1c8->super_BaseGenerator,pDVar7,
                     (string *)local_278);
          if ((undefined1 *)local_278._0_8_ != auStack_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
          }
          local_258._M_unused._M_object = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          std::__cxx11::string::append(local_258._M_pod_data);
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      (local_258._M_pod_data,*(ulong *)field->bytesize);
          local_278._0_8_ = auStack_268;
          pCVar17 = (CodeWriter *)(plVar13 + 2);
          if ((CodeWriter *)*plVar13 == pCVar17) {
            auStack_268._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
            auStack_268._8_8_ = plVar13[3];
          }
          else {
            auStack_268._0_8_ = *(undefined8 *)&(pCVar17->value_map_)._M_t._M_impl;
            local_278._0_8_ = (CodeWriter *)*plVar13;
          }
          local_278._8_8_ = plVar13[1];
          *plVar13 = (long)pCVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if ((_Base_ptr)local_258._M_unused._0_8_ != (_Base_ptr)local_248) {
            operator_delete(local_258._M_unused._M_object,
                            (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
          }
          local_258._M_unused._M_object = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,_Var24._M_p,
                     (long)&(local_290->super_Definition).name._M_dataplus._M_p + _Var24._M_p);
          std::__cxx11::string::append(local_258._M_pod_data);
          local_228._8_8_ = (_Alloc_hider *)0x0;
          local_228._M_unused._M_object = operator_new(0x18);
          *(CodeWriter **)local_228._M_unused._0_8_ = local_238;
          *(string **)((long)local_228._M_unused._0_8_ + 8) = (string *)local_278;
          *(Type **)((long)local_228._M_unused._0_8_ + 0x10) = (Type *)&stack0xfffffffffffffd68;
          pcStack_210 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1198:65)>
                        ::_M_invoke;
          local_218 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1198:65)>
                      ::_M_manager;
          GenerateGetterOneLine
                    (local_238,(string *)local_278,(string *)&local_258,
                     (function<void_()> *)&local_228);
          if (local_218 != (code *)0x0) {
            (*local_218)(&local_228,&local_228,3);
          }
          if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
            operator_delete(local_258._M_unused._M_object,
                            (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_258,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffd68);
          local_228._M_unused._M_object = &local_218;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,_Var24._M_p,
                     (long)&(local_290->super_Definition).name._M_dataplus._M_p + _Var24._M_p);
          std::__cxx11::string::append(local_228._M_pod_data);
          local_208._M_unused._M_object = local_238;
          local_208._8_8_ = local_f0;
          pcStack_1f0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
                        ::_M_invoke;
          local_1f8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
                      ::_M_manager;
          GenerateFun(local_238,(string *)local_278,(string *)&local_258,(string *)&local_228,
                      (function<void_()> *)&local_208,false);
          if (local_1f8 != (code *)0x0) {
            (*local_1f8)(&local_208,&local_208,3);
          }
          if ((code **)local_228._M_unused._0_8_ != &local_218) {
            operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
          }
          if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
            operator_delete(local_258._M_unused._M_object,
                            (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
          }
          if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
          }
          if (_Var24._M_p != auStack_288) {
            operator_delete(_Var24._M_p,(ulong)(auStack_288._0_8_ + 1));
          }
        }
        if ((((local_1c8->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
          BVar4 = *(BaseType *)&(field->fields).dict._M_t._M_impl.field_0x4;
          local_290 = *(StructDef **)
                       &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header;
          auStack_288._0_8_ =
               (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          uVar3 = *(undefined2 *)
                   &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((char)local_22c == '\0') {
            BVar23 = *(BaseType *)&(field->fields).dict._M_t._M_impl;
            uStack_27e = *(undefined4 *)
                          ((long)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left + 2);
            auStack_288._8_2_ = uVar3;
            uStack_27a = *(undefined2 *)
                          ((long)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left + 6);
            BVar25 = BVar4;
          }
          else {
            auStack_288._8_2_ = uVar3;
            BVar23 = BVar4;
            BVar25 = BASE_TYPE_NONE;
          }
          local_258._M_unused._M_object = local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"mutate","");
          local_228._M_unused._M_object = &local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
          IdlNamer::LegacyKotlinMethod
                    ((string *)local_278,local_138,(string *)&local_258,(FieldDef *)field,
                     (string *)&local_228);
          if ((code **)local_228._M_unused._0_8_ != &local_218) {
            operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
          }
          if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
            operator_delete(local_258._M_unused._M_object,
                            (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
          }
          t_00 = InlineSize((Type *)&stack0xfffffffffffffd68);
          NumToString<unsigned_long>((string *)&local_258,t_00);
          (*(local_138->super_Namer)._vptr_Namer[0x12])(&local_1e8,local_138,field);
          plVar13 = (long *)std::__cxx11::string::append(local_1e8._M_pod_data);
          local_208._M_unused._M_object = &local_1f8;
          pCVar17 = (CodeWriter *)(plVar13 + 2);
          if ((CodeWriter *)*plVar13 == pCVar17) {
            local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
            pcStack_1f0 = (code *)plVar13[3];
          }
          else {
            local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
            local_208._M_unused._M_object = (CodeWriter *)*plVar13;
          }
          local_208._8_8_ = plVar13[1];
          *plVar13 = (long)pCVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          GenTypeGet_abi_cxx11_(&local_1c0,local_1c8,(Type *)&stack0xfffffffffffffd68);
          pcVar20 = (code *)0xf;
          if ((CodeWriter *)local_208._M_unused._0_8_ != (CodeWriter *)&local_1f8) {
            pcVar20 = local_1f8;
          }
          if (pcVar20 < (code *)(local_1c0._M_string_length + local_208._8_8_)) {
            uVar21 = (code *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              uVar21 = local_1c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < (code *)(local_1c0._M_string_length + local_208._8_8_))
            goto LAB_001dbd3a;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_1c0,0,(char *)0x0,
                                 local_208._M_unused._M_member_pointer);
          }
          else {
LAB_001dbd3a:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_208._M_pod_data,(ulong)local_1c0._M_dataplus._M_p);
          }
          local_228._M_unused._M_object = &local_218;
          ppcVar1 = (code **)(puVar15 + 2);
          if ((code **)*puVar15 == ppcVar1) {
            local_218 = *ppcVar1;
            pcStack_210 = (code *)puVar15[3];
          }
          else {
            local_218 = *ppcVar1;
            local_228._M_unused._M_object = (code **)*puVar15;
          }
          local_228._8_8_ = puVar15[1];
          *puVar15 = ppcVar1;
          puVar15[1] = 0;
          *(undefined1 *)ppcVar1 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          if ((CodeWriter *)local_208._M_unused._0_8_ != (CodeWriter *)&local_1f8) {
            operator_delete(local_208._M_unused._M_object,(ulong)(local_1f8 + 1));
          }
          if ((_Base_ptr)local_1e8._M_unused._0_8_ != (_Base_ptr)&local_1d8) {
            operator_delete(local_1e8._M_unused._M_object,(ulong)((long)&local_1d8->_M_color + 1));
          }
          if ((char)local_22c != '\0') {
            std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x3676b5);
          }
          if (BVar23 == BASE_TYPE_BOOL) {
            (*(local_138->super_Namer)._vptr_Namer[0x12])(&local_1c0,local_138,field);
            plVar13 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1c0,0,(char *)0x0,0x3676be);
            local_1e8._M_unused._M_object = &local_1d8;
            p_Var19 = (_Base_ptr)(plVar13 + 2);
            if ((_Base_ptr)*plVar13 == p_Var19) {
              local_1d8 = *(_Base_ptr *)p_Var19;
              p_Stack_1d0 = (_Base_ptr)plVar13[3];
            }
            else {
              local_1d8 = *(_Base_ptr *)p_Var19;
              local_1e8._M_unused._M_object = (_Base_ptr)*plVar13;
            }
            local_1e8._8_8_ = plVar13[1];
            *plVar13 = (long)p_Var19;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append(local_1e8._M_pod_data);
            local_208._M_unused._M_object = &local_1f8;
            pCVar17 = (CodeWriter *)(plVar13 + 2);
            if ((CodeWriter *)*plVar13 == pCVar17) {
              local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
              pcStack_1f0 = (code *)plVar13[3];
            }
            else {
              local_1f8 = *(code **)&(pCVar17->value_map_)._M_t._M_impl;
              local_208._M_unused._M_object = (CodeWriter *)*plVar13;
            }
            local_208._8_8_ = plVar13[1];
            *plVar13 = (long)pCVar17;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if ((_Base_ptr)local_1e8._M_unused._0_8_ != (_Base_ptr)&local_1d8) {
              operator_delete(local_1e8._M_unused._M_object,(ulong)((long)&local_1d8->_M_color + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            (*(local_138->super_Namer)._vptr_Namer[0x12])(&local_208,local_138,field);
          }
          if ((char)local_22c == '\0') {
            if (local_1a0->fixed == true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1e8,"bb_pos + ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0);
            }
            else {
              local_1e8._M_unused._M_object = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"o + bb_pos","");
            }
            if (bVar8) goto LAB_001dc062;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1e8,"__vector(o) + j * ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_258);
            if ((bool)(bVar8 | BVar4 - BASE_TYPE_UTYPE < 0xc)) {
LAB_001dc062:
              if (local_1a0->fixed == true) {
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1c0,"ByteBuffer","");
                local_158._8_8_ = 0;
                local_158._M_unused._M_object = operator_new(0x40);
                *(CodeWriter **)local_158._M_unused._0_8_ = local_238;
                *(KotlinGenerator **)((long)local_158._M_unused._0_8_ + 8) = local_1c8;
                *(Type **)((long)local_158._M_unused._0_8_ + 0x10) =
                     (Type *)&stack0xfffffffffffffd68;
                *(_Any_data **)((long)local_158._M_unused._0_8_ + 0x18) = &local_1e8;
                *(_Any_data **)((long)local_158._M_unused._0_8_ + 0x20) = &local_208;
                *(StructDef **)((long)local_158._M_unused._0_8_ + 0x28) = field;
                *(StructDef **)((long)local_158._M_unused._0_8_ + 0x30) = local_1a0;
                *(_Base_ptr *)((long)local_158._M_unused._0_8_ + 0x38) = (_Base_ptr)local_f0;
                local_140 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_invoke;
                local_148 = (_Base_ptr)
                            std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_manager;
                GenerateFunOneLine(local_238,(string *)local_278,(string *)&local_228,&local_1c0,
                                   (function<void_()> *)&local_158,false);
                if (local_148 != (_Base_ptr)0x0) {
                  (*(code *)local_148)(&local_158,&local_158,3);
                }
              }
              else {
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Boolean","");
                local_158._8_8_ = 0;
                local_158._M_unused._M_object = operator_new(0x40);
                *(CodeWriter **)local_158._M_unused._0_8_ = local_238;
                *(KotlinGenerator **)((long)local_158._M_unused._0_8_ + 8) = local_1c8;
                *(Type **)((long)local_158._M_unused._0_8_ + 0x10) =
                     (Type *)&stack0xfffffffffffffd68;
                *(_Any_data **)((long)local_158._M_unused._0_8_ + 0x18) = &local_1e8;
                *(_Any_data **)((long)local_158._M_unused._0_8_ + 0x20) = &local_208;
                *(StructDef **)((long)local_158._M_unused._0_8_ + 0x28) = field;
                *(StructDef **)((long)local_158._M_unused._0_8_ + 0x30) = local_1a0;
                *(_Base_ptr *)((long)local_158._M_unused._0_8_ + 0x38) = (_Base_ptr)local_f0;
                local_140 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_invoke;
                local_148 = (_Base_ptr)
                            std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_manager;
                GenerateFun(local_238,(string *)local_278,(string *)&local_228,&local_1c0,
                            (function<void_()> *)&local_158,false);
                if (local_148 != (_Base_ptr)0x0) {
                  (*(code *)local_148)(&local_158,&local_158,3);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
            }
          }
          if ((_Base_ptr)local_1e8._M_unused._0_8_ != (_Base_ptr)&local_1d8) {
            operator_delete(local_1e8._M_unused._M_object,(ulong)((long)&local_1d8->_M_color + 1));
          }
          if ((CodeWriter *)local_208._M_unused._0_8_ != (CodeWriter *)&local_1f8) {
            operator_delete(local_208._M_unused._M_object,(ulong)(local_1f8 + 1));
          }
          if ((code **)local_228._M_unused._0_8_ != &local_218) {
            operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
          }
          if ((CodeWriter *)local_258._M_unused._0_8_ != (CodeWriter *)local_248) {
            operator_delete(local_258._M_unused._M_object,
                            (ulong)((long)(_Rb_tree_color *)local_248._0_8_ + 1));
          }
          if ((CodeWriter *)local_278._0_8_ != (CodeWriter *)auStack_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(auStack_268._0_8_ + 1));
          }
          _Var24._M_p = (pointer)CONCAT44(BVar25,BVar23);
        }
        this = local_1c8;
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((_Alloc_hider *)local_f0._0_8_ != (_Alloc_hider *)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_p != &local_78) {
          operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
        }
        if ((code **)local_130._M_unused._0_8_ != &local_120) {
          operator_delete(local_130._M_unused._M_object,(ulong)(local_120 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar22 = ppFVar22 + 1;
    } while (ppFVar22 !=
             local_48.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((local_1a0->has_key != false) && (local_1a0->fixed == false)) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"keysCompare","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"o1: Int, o2: Int, _bb: ByteBuffer","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Int","");
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = operator_new(0x18);
    *(_Alloc_hider **)local_130._M_unused._0_8_ = &local_b0;
    *(CodeWriter **)((long)local_130._M_unused._0_8_ + 8) = local_238;
    *(KotlinGenerator **)((long)local_130._M_unused._0_8_ + 0x10) = local_1c8;
    local_118 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1271:11)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1271:11)>
                ::_M_manager;
    GenerateOverrideFun(local_238,&local_198,&local_110,&local_d0,(function<void_()> *)&local_130);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto ucast = CastToUsigned(field);
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = __offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      writer.SetValue("ucast", ucast);

      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            writer += "{{bbgetter}}(bb_pos + {{offset}}){{ucast}}";
          });
        } else {
          GenerateGetter(writer, field_name, return_type, [&]() {
            writer += "val o = __offset({{offset}})";
            writer +=
                "return if(o != 0) {{bbgetter}}"
                "(o + bb_pos){{ucast}} else "
                "{{field_default}}";
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.__assign(bb_pos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type,
                  [&]() { writer += "obj.__assign(bb_pos + {{offset}}, bb)"; });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = __offset(4)
              //      return if(o != 0) {
              //          obj.__assign(o + bb_pos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFun(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("o + bb_pos", fixed));
                    OffsetWrapper(
                        writer, offset_val,
                        [&]() { writer += "obj.__assign({{seek}}, bb)"; },
                        [&]() {
                          if (field.IsRequired()) {
                            writer +=
                                "throw AssertionError(\"No value for "
                                "(required) field {{field_name}}\")";
                          } else {
                            writer += "null";
                          }
                        });
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = __offset(10)
            //          return if (o != 0) {
            //              __string(o + bb_pos)
            //          } else {
            //              null
            //          }
            //     }
            // ? adds nullability annotation
            GenerateGetter(writer, field_name, return_type, [&]() {
              writer += "val o = __offset({{offset}})";
              writer += "return if (o != 0) {";
              writer.IncrementIdentLevel();
              writer += "__string(o + bb_pos)";
              writer.DecrementIdentLevel();
              writer += "} else {";
              writer.IncrementIdentLevel();
              if (field.IsRequired()) {
                writer +=
                    "throw AssertionError(\"No value for (required) field "
                    "{{field_name}}\")";
              } else {
                writer += "null";
              }
              writer.DecrementIdentLevel();
              writer += "}";
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = __offset(14)
            //     return if (o != 0) {
            //         bb.get(__vector(o) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFun(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "__vector(o) + j * " + inline_size;
              auto not_found =
                  field.IsRequired()
                      ? "throw IndexOutOfBoundsException(\"Index out of range: "
                        "$j, vector {{field_name}} is empty\")"
                      : NotFoundReturn(field.value.type.element);
              auto found = "";
              writer.SetValue("index", index);
              switch (vectortype.base_type) {
                case BASE_TYPE_STRUCT: {
                  bool fixed = vectortype.struct_def->fixed;
                  writer.SetValue("index", Indirect(index, fixed));
                  found = "obj.__assign({{index}}, bb)";
                  break;
                }
                case BASE_TYPE_UNION:
                  found = "{{bbgetter}}(obj, {{index}}){{ucast}}";
                  break;
                default: found = "{{bbgetter}}({{index}}){{ucast}}";
              }
              OffsetWrapper(
                  writer, offset_val, [&]() { writer += found; },
                  [&]() { writer += not_found; });
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFun(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += OffsetWrapperOneLine(
                      offset_val, bbgetter + "(obj, o + bb_pos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetter(writer, field_name + "Length", "Int", [&]() {
          writer += OffsetWrapperOneLine(offset_val, "__vector_len(o)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = WrapInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFun(writer, name, params, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(null, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFun(writer, name, param2, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(obj, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));
        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // val inventoryByteBuffer: ByteBuffer
        //     get =  __vector_as_bytebuffer(14, 1)

        GenerateGetterOneLine(
            writer, field_name + "AsByteBuffer", "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_as_bytebuffer({{offset}}, {{end}})";
            });

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(_bb: Bytebuffer):
        //     ByteBuffer = __vector_as_bytebuffer(_bb, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "InByteBuffer", "_bb: ByteBuffer",
            "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_in_bytebuffer(_bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = WrapInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFun(writer, nested_method_name, "obj: " + nested_type_name,
                    nested_type_name + "?", [&]() {
                      OffsetWrapper(
                          writer, offset_val,
                          [&]() {
                            writer +=
                                "obj.__assign(__indirect(__vector(o)), bb)";
                          },
                          [&]() { writer += "null"; });
                    });
      }

      // Generate mutators for scalar fields or vectors of scalars.
      if (parser_.opts.mutable_buffer) {
        auto value_type = field.value.type;
        auto underlying_type = value_base_type == BASE_TYPE_VECTOR
                                   ? value_type.VectorType()
                                   : value_type;
        auto name = namer_.LegacyKotlinMethod("mutate", field, "");
        auto size = NumToString(InlineSize(underlying_type));
        auto params = namer_.Field(field) + ": " + GenTypeGet(underlying_type);
        // A vector mutator also needs the index of the vector element it should
        // mutate.
        if (value_base_type == BASE_TYPE_VECTOR) params.insert(0, "j: Int, ");

        // Boolean parameters have to be explicitly converted to byte
        // representation.
        auto setter_parameter =
            underlying_type.base_type == BASE_TYPE_BOOL
                ? "(if(" + namer_.Field(field) + ") 1 else 0).toByte()"
                : namer_.Field(field);

        auto setter_index =
            value_base_type == BASE_TYPE_VECTOR
                ? "__vector(o) + j * " + size
                : (struct_def.fixed ? "bb_pos + " + offset_val : "o + bb_pos");
        if (IsScalar(value_base_type) ||
            (value_base_type == BASE_TYPE_VECTOR &&
             IsScalar(value_type.VectorType().base_type))) {
          auto statements = [&]() {
            writer.SetValue("bbsetter", ByteBufferSetter(underlying_type));
            writer.SetValue("index", setter_index);
            writer.SetValue("params", setter_parameter);
            writer.SetValue("cast", CastToSigned(field));
            if (struct_def.fixed) {
              writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
            } else {
              OffsetWrapper(
                  writer, offset_val,
                  [&]() {
                    writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
                    writer += "true";
                  },
                  [&]() { writer += "false"; });
            }
          };

          if (struct_def.fixed) {
            GenerateFunOneLine(writer, name, params, "ByteBuffer", statements);
          } else {
            GenerateFun(writer, name, params, "Boolean", statements);
          }
        }
      }
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare", "o1: Int, o2: Int, _bb: ByteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(__offset({{offset}}, o1, "
                  "_bb), __offset({{offset}}, o2, _bb), _bb)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "_bb", "o1");
              auto getter2 = GenLookupByKey(key_field, "_bb", "o2");
              writer += "val val_1 = " + getter1;
              writer += "val val_2 = " + getter2;
              writer += "return (val_1 - val_2).sign";
            }
          });
    }
  }